

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_ppt_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  uchar *puVar2;
  size_t size;
  
  (ms->parms).siz.height = 0;
  if (ms->len == 0) {
    return -1;
  }
  iVar1 = jpc_getuint8(in,(uint_fast8_t *)&(ms->parms).soc);
  if (iVar1 == 0) {
    size = ms->len - 1;
    (ms->parms).sot.len = size;
    if (size == 0) {
      (ms->parms).siz.height = 0;
      return 0;
    }
    puVar2 = (uchar *)jas_malloc(size);
    (ms->parms).ppm.data = puVar2;
    if (puVar2 == (uchar *)0x0) {
      return -1;
    }
    iVar1 = jas_stream_read(in,puVar2,*(uint *)((long)&ms->parms + 8));
    if (iVar1 == *(int *)((long)&ms->parms + 8)) {
      return 0;
    }
  }
  puVar2 = (ms->parms).ppm.data;
  if (puVar2 != (uchar *)0x0) {
    jas_free(puVar2);
  }
  return -1;
}

Assistant:

static int jpc_ppt_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_ppt_t *ppt = &ms->parms.ppt;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	ppt->data = 0;

	if (ms->len < 1) {
		goto error;
	}
	if (jpc_getuint8(in, &ppt->ind)) {
		goto error;
	}
	ppt->len = ms->len - 1;
	if (ppt->len > 0) {
		if (!(ppt->data = jas_malloc(ppt->len))) {
			goto error;
		}
		if (jas_stream_read(in, (char *) ppt->data, ppt->len) != JAS_CAST(int, ppt->len)) {
			goto error;
		}
	} else {
		ppt->data = 0;
	}
	return 0;

error:
	jpc_ppt_destroyparms(ms);
	return -1;
}